

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

int Aig_ManComputeReachable
              (DdManager *dd,Aig_Man_t *p,DdNode **pbParts,DdNode *bInitial,DdNode **pbOutputs,
              Saig_ParBbr_t *pPars,int fCheckOutputs)

{
  void *pvVar1;
  bool bVar2;
  FILE *pFVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  abctime aVar10;
  Vec_Ptr_t *p_00;
  abctime aVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  double dVar14;
  double dVar15;
  double nMints_1;
  double nMints;
  DdNode *bIntersect;
  int fixedPoint;
  Vec_Ptr_t *vOnionRings;
  abctime clk;
  int nThreshold;
  int status;
  int nBddSize;
  int nIters;
  int i;
  Cudd_ReorderingType method;
  DdNode *bTemp;
  DdNode *bNext;
  DdNode *bCurrent;
  DdNode *bCubeCs;
  DdNode *bReached;
  Bbr_ImageTree2_t *pTree2;
  Bbr_ImageTree_t *pTree;
  Saig_ParBbr_t *pSStack_40;
  int fInternalReorder;
  Saig_ParBbr_t *pPars_local;
  DdNode **pbOutputs_local;
  DdNode *bInitial_local;
  DdNode **pbParts_local;
  Aig_Man_t *p_local;
  DdManager *dd_local;
  
  pTree._4_4_ = 0;
  pTree2 = (Bbr_ImageTree2_t *)0x0;
  bReached = (DdNode *)0x0;
  bTemp = (DdNode *)0x0;
  nThreshold = 0;
  clk._0_4_ = 10000;
  pSStack_40 = pPars;
  pPars_local = (Saig_ParBbr_t *)pbOutputs;
  pbOutputs_local = (DdNode **)bInitial;
  bInitial_local = (DdNode *)pbParts;
  pbParts_local = (DdNode **)p;
  p_local = (Aig_Man_t *)dd;
  aVar10 = Abc_Clock();
  bVar2 = false;
  iVar5 = Cudd_ReorderingStatus((DdManager *)p_local,(Cudd_ReorderingType *)&nIters);
  if (iVar5 != 0) {
    Cudd_AutodynDisable((DdManager *)p_local);
  }
  pAVar4 = p_local;
  iVar6 = Saig_ManPiNum((Aig_Man_t *)pbParts_local);
  iVar7 = Saig_ManCiNum((Aig_Man_t *)pbParts_local);
  bCurrent = Bbr_bddComputeRangeCube((DdManager *)pAVar4,iVar6,iVar7);
  Cudd_Ref(bCurrent);
  pAVar4 = p_local;
  pDVar12 = bCurrent;
  if (pSStack_40->fPartition == 0) {
    iVar6 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
    pDVar13 = bInitial_local;
    iVar7 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
    pvVar1 = p_local->pImpData;
    iVar8 = Saig_ManCiNum((Aig_Man_t *)pbParts_local);
    bReached = (DdNode *)
               Bbr_bddImageStart2((DdManager *)pAVar4,pDVar12,iVar6,(DdNode **)pDVar13,iVar7,
                                  (DdNode **)((long)pvVar1 + (long)iVar8 * 8),pSStack_40->fVerbose);
  }
  else {
    iVar6 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
    pDVar13 = bInitial_local;
    iVar7 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
    pvVar1 = p_local->pImpData;
    iVar8 = Saig_ManCiNum((Aig_Man_t *)pbParts_local);
    pTree2 = (Bbr_ImageTree2_t *)
             Bbr_bddImageStart((DdManager *)pAVar4,pDVar12,iVar6,(DdNode **)pDVar13,iVar7,
                               (DdNode **)((long)pvVar1 + (long)iVar8 * 8),pSStack_40->nBddMax,
                               pSStack_40->fVerbose);
  }
  Cudd_RecursiveDeref((DdManager *)p_local,bCurrent);
  if (pTree2 == (Bbr_ImageTree2_t *)0x0) {
    if (pSStack_40->fSilent == 0) {
      printf("BDDs blew up during qualitification scheduling.  ");
    }
    dd_local._4_4_ = -1;
  }
  else {
    if (iVar5 != 0) {
      Cudd_AutodynEnable((DdManager *)p_local,nIters);
    }
    p_00 = Vec_PtrAlloc(1000);
    bNext = (DdNode *)pbOutputs_local;
    Cudd_Ref((DdNode *)pbOutputs_local);
    bCubeCs = (DdNode *)pbOutputs_local;
    Cudd_Ref((DdNode *)pbOutputs_local);
    Vec_PtrPush(p_00,bNext);
    Cudd_Ref(bNext);
    for (status = 0; status < pSStack_40->nIterMax; status = status + 1) {
      if (pSStack_40->TimeLimit != 0) {
        iVar5 = pSStack_40->TimeLimit;
        aVar11 = Abc_Clock();
        if ((long)iVar5 <= (aVar11 - aVar10) / 1000000) {
          printf("Reached timeout after image computation (%d seconds).\n",
                 (ulong)(uint)pSStack_40->TimeLimit,(aVar11 - aVar10) % 1000000);
          Vec_PtrFree(p_00);
          if (pSStack_40->fPartition == 0) {
            Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)bReached);
          }
          else {
            Bbr_bddImageTreeDelete((Bbr_ImageTree_t *)pTree2);
          }
          pSStack_40->iFrame = status + -1;
          return -1;
        }
      }
      if (pSStack_40->fPartition == 0) {
        bTemp = Bbr_bddImageCompute2((Bbr_ImageTree2_t *)bReached,bNext);
      }
      else {
        bTemp = Bbr_bddImageCompute((Bbr_ImageTree_t *)pTree2,bNext);
      }
      if (bTemp == (DdNode *)0x0) {
        if (pSStack_40->fSilent == 0) {
          printf("BDDs blew up during image computation.  ");
        }
        if (pSStack_40->fPartition == 0) {
          Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)bReached);
        }
        else {
          Bbr_bddImageTreeDelete((Bbr_ImageTree_t *)pTree2);
        }
        Vec_PtrFree(p_00);
        pSStack_40->iFrame = status + -1;
        return -1;
      }
      Cudd_Ref(bTemp);
      Cudd_RecursiveDeref((DdManager *)p_local,bNext);
      _i = bTemp;
      bTemp = Cudd_bddVarMap((DdManager *)p_local,bTemp);
      Cudd_Ref(bTemp);
      Cudd_RecursiveDeref((DdManager *)p_local,_i);
      iVar5 = Cudd_bddLeq((DdManager *)p_local,bTemp,bCubeCs);
      if (iVar5 != 0) {
        bVar2 = true;
        break;
      }
      nThreshold = Cudd_DagSize(bTemp);
      if (pSStack_40->nBddMax < nThreshold) break;
      for (nBddSize = 0; iVar5 = Saig_ManPoNum((Aig_Man_t *)pbParts_local), nBddSize < iVar5;
          nBddSize = nBddSize + 1) {
        if ((fCheckOutputs != 0) &&
           (iVar5 = Cudd_bddLeq((DdManager *)p_local,bTemp,
                                (DdNode *)
                                (*(ulong *)(&pPars_local->TimeLimit + (long)nBddSize * 2) ^ 1)),
           iVar5 == 0)) {
          pDVar12 = Cudd_bddIntersect((DdManager *)p_local,bTemp,
                                      *(DdNode **)(&pPars_local->TimeLimit + (long)nBddSize * 2));
          Cudd_Ref(pDVar12);
          if (pbParts_local[0x33] != (DdNode *)0x0) {
            __assert_fail("p->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                          ,0x151,
                          "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                         );
          }
          pDVar13 = (DdNode *)
                    Aig_ManVerifyUsingBddsCountExample
                              ((Aig_Man_t *)pbParts_local,(DdManager *)p_local,
                               (DdNode **)bInitial_local,p_00,pDVar12,nBddSize,pSStack_40->fVerbose,
                               pSStack_40->fSilent);
          pbParts_local[0x33] = pDVar13;
          Cudd_RecursiveDeref((DdManager *)p_local,pDVar12);
          if (pSStack_40->fSilent == 0) {
            pDVar12 = *pbParts_local;
            uVar9 = Vec_PtrSize(p_00);
            Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d. ",(ulong)(uint)nBddSize
                      ,pDVar12,(ulong)uVar9);
          }
          Cudd_RecursiveDeref((DdManager *)p_local,bCubeCs);
          bCubeCs = (DdNode *)0x0;
          pSStack_40->iFrame = status;
          break;
        }
      }
      iVar5 = Saig_ManPoNum((Aig_Man_t *)pbParts_local);
      if (nBddSize < iVar5) break;
      bNext = Cudd_bddAnd((DdManager *)p_local,bTemp,(DdNode *)((ulong)bCubeCs ^ 1));
      Cudd_Ref(bNext);
      Vec_PtrPush(p_00,bNext);
      Cudd_Ref(bNext);
      _i = bCubeCs;
      bCubeCs = Cudd_bddOr((DdManager *)p_local,bCubeCs,bTemp);
      Cudd_Ref(bCubeCs);
      Cudd_RecursiveDeref((DdManager *)p_local,_i);
      Cudd_RecursiveDeref((DdManager *)p_local,bTemp);
      if (pSStack_40->fVerbose != 0) {
        fprintf(_stdout,"Frame = %3d. BDD = %5d. ",(ulong)(uint)status,(ulong)(uint)nThreshold);
      }
      pFVar3 = _stdout;
      if (((pTree._4_4_ != 0) && (pSStack_40->fReorder != 0)) && ((int)clk < nThreshold)) {
        if (pSStack_40->fVerbose != 0) {
          uVar9 = Cudd_DagSize(bCubeCs);
          fprintf(pFVar3,"Reordering... Before = %5d. ",(ulong)uVar9);
        }
        Cudd_ReduceHeap((DdManager *)p_local,CUDD_REORDER_SYMM_SIFT,100);
        Cudd_AutodynDisable((DdManager *)p_local);
        pFVar3 = _stdout;
        if (pSStack_40->fVerbose != 0) {
          uVar9 = Cudd_DagSize(bCubeCs);
          fprintf(pFVar3,"After = %5d.\r",(ulong)uVar9);
        }
        clk._0_4_ = (int)clk << 1;
      }
      if (pSStack_40->fVerbose != 0) {
        fprintf(_stdout,"\n");
      }
      pAVar4 = p_local;
      pDVar12 = bCubeCs;
      if (pSStack_40->fVerbose != 0) {
        iVar5 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
        dVar14 = Cudd_CountMinterm((DdManager *)pAVar4,pDVar12,iVar5);
        pFVar3 = _stdout;
        iVar5 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
        dVar15 = pow(2.0,(double)iVar5);
        fprintf(pFVar3,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar14,
                (dVar14 * 100.0) / dVar15);
        fflush(_stdout);
      }
    }
    Cudd_RecursiveDeref((DdManager *)p_local,bTemp);
    for (nBddSize = 0; iVar5 = Vec_PtrSize(p_00), nBddSize < iVar5; nBddSize = nBddSize + 1) {
      _i = (DdNode *)Vec_PtrEntry(p_00,nBddSize);
      Cudd_RecursiveDeref((DdManager *)p_local,_i);
    }
    Vec_PtrFree(p_00);
    if (pSStack_40->fPartition == 0) {
      Bbr_bddImageTreeDelete2((Bbr_ImageTree2_t *)bReached);
    }
    else {
      Bbr_bddImageTreeDelete((Bbr_ImageTree_t *)pTree2);
    }
    pAVar4 = p_local;
    pDVar12 = bCubeCs;
    if (bCubeCs == (DdNode *)0x0) {
      dd_local._4_4_ = 0;
    }
    else {
      if (pSStack_40->fVerbose != 0) {
        iVar5 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
        dVar14 = Cudd_CountMinterm((DdManager *)pAVar4,pDVar12,iVar5);
        if ((pSStack_40->nIterMax < status) || (pSStack_40->nBddMax < nThreshold)) {
          fprintf(_stdout,"Reachability analysis is stopped after %d frames.\n",(ulong)(uint)status)
          ;
        }
        else {
          fprintf(_stdout,"Reachability analysis completed after %d frames.\n",(ulong)(uint)status);
        }
        pFVar3 = _stdout;
        iVar5 = Saig_ManRegNum((Aig_Man_t *)pbParts_local);
        dVar15 = pow(2.0,(double)iVar5);
        fprintf(pFVar3,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar14,
                (dVar14 * 100.0) / dVar15);
        fflush(_stdout);
      }
      Cudd_RecursiveDeref((DdManager *)p_local,bCubeCs);
      if (bVar2) {
        if (pSStack_40->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)(uint)status);
        }
        pSStack_40->iFrame = status + -1;
        dd_local._4_4_ = 1;
      }
      else {
        if ((status < pSStack_40->nIterMax) && (nThreshold < pSStack_40->nBddMax)) {
          __assert_fail("nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                        ,0x1a4,
                        "int Aig_ManComputeReachable(DdManager *, Aig_Man_t *, DdNode **, DdNode *, DdNode **, Saig_ParBbr_t *, int)"
                       );
        }
        if (pSStack_40->fSilent == 0) {
          printf("Verified only for states reachable in %d frames.  ",(ulong)(uint)status);
        }
        pSStack_40->iFrame = status + -1;
        dd_local._4_4_ = -1;
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int Aig_ManComputeReachable( DdManager * dd, Aig_Man_t * p, DdNode ** pbParts, DdNode * bInitial, DdNode ** pbOutputs, Saig_ParBbr_t * pPars, int fCheckOutputs )
{
    int fInternalReorder = 0;
    Bbr_ImageTree_t * pTree = NULL; // Suppress "might be used uninitialized"
    Bbr_ImageTree2_t * pTree2 = NULL; // Supprses "might be used uninitialized"
    DdNode * bReached, * bCubeCs;
    DdNode * bCurrent;
    DdNode * bNext = NULL; // Suppress "might be used uninitialized"
    DdNode * bTemp;
    Cudd_ReorderingType method;
    int i, nIters, nBddSize = 0, status;
    int nThreshold = 10000;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;
    int fixedPoint = 0;

    status = Cudd_ReorderingStatus( dd, &method );
    if ( status )
        Cudd_AutodynDisable( dd );

    // start the image computation
    bCubeCs  = Bbr_bddComputeRangeCube( dd, Saig_ManPiNum(p), Saig_ManCiNum(p) );    Cudd_Ref( bCubeCs );
    if ( pPars->fPartition )
        pTree = Bbr_bddImageStart( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->nBddMax, pPars->fVerbose );
    else
        pTree2 = Bbr_bddImageStart2( dd, bCubeCs, Saig_ManRegNum(p), pbParts, Saig_ManRegNum(p), dd->vars+Saig_ManCiNum(p), pPars->fVerbose );
    Cudd_RecursiveDeref( dd, bCubeCs );
    if ( pTree == NULL )
    {
        if ( !pPars->fSilent )
            printf( "BDDs blew up during qualitification scheduling.  " );
        return -1;
    }

    if ( status )
        Cudd_AutodynEnable( dd, method );

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // perform reachability analysis
    bCurrent = bInitial;   Cudd_Ref( bCurrent );
    bReached = bInitial;   Cudd_Ref( bReached );
    Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
    for ( nIters = 0; nIters < pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
        {
            printf( "Reached timeout after image computation (%d seconds).\n",  pPars->TimeLimit );
            Vec_PtrFree( vOnionRings );
            // undo the image tree
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            pPars->iFrame = nIters - 1;
            return -1;
        }

        // compute the next states
        if ( pPars->fPartition )
            bNext = Bbr_bddImageCompute( pTree, bCurrent );           
        else
            bNext = Bbr_bddImageCompute2( pTree2, bCurrent );  
        if ( bNext == NULL )
        {
            if ( !pPars->fSilent )
                printf( "BDDs blew up during image computation.  " );
            if ( pPars->fPartition )
                Bbr_bddImageTreeDelete( pTree );
            else
                Bbr_bddImageTreeDelete2( pTree2 );
            Vec_PtrFree( vOnionRings );
            pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bCurrent );

        // remap these states into the current state vars
        bNext = Cudd_bddVarMap( dd, bTemp = bNext );                    Cudd_Ref( bNext );
        Cudd_RecursiveDeref( dd, bTemp );
        // check if there are any new states
        if ( Cudd_bddLeq( dd, bNext, bReached ) ) {
            fixedPoint = 1;
            break;
        }
        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > pPars->nBddMax )
            break;
        // check the result
        for ( i = 0; i < Saig_ManPoNum(p); i++ )
        {
            if ( fCheckOutputs && !Cudd_bddLeq( dd, bNext, Cudd_Not(pbOutputs[i]) ) )
            {
                DdNode * bIntersect;
                bIntersect = Cudd_bddIntersect( dd, bNext, pbOutputs[i] );  Cudd_Ref( bIntersect );
                assert( p->pSeqModel == NULL );
                p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                    vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
                Cudd_RecursiveDeref( dd, bIntersect );
                if ( !pPars->fSilent )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, Vec_PtrSize(vOnionRings) );
                Cudd_RecursiveDeref( dd, bReached );
                bReached = NULL;
                pPars->iFrame = nIters;
                break;
            }
        }
        if ( i < Saig_ManPoNum(p) )
            break;
        // get the new states
        bCurrent = Cudd_bddAnd( dd, bNext, Cudd_Not(bReached) );        Cudd_Ref( bCurrent );
        Vec_PtrPush( vOnionRings, bCurrent );  Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( dd, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( dd, bTemp );
        // add to the reached states
        bReached = Cudd_bddOr( dd, bTemp = bReached, bNext );           Cudd_Ref( bReached );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bNext );
        if ( pPars->fVerbose )
            fprintf( stdout, "Frame = %3d. BDD = %5d. ", nIters, nBddSize );
        if ( fInternalReorder && pPars->fReorder && nBddSize > nThreshold )
        {
            if ( pPars->fVerbose )
                fprintf( stdout, "Reordering... Before = %5d. ", Cudd_DagSize(bReached) );
            Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
            Cudd_AutodynDisable( dd );
            if ( pPars->fVerbose )
                fprintf( stdout, "After = %5d.\r", Cudd_DagSize(bReached) );
            nThreshold *= 2;
        }
        if ( pPars->fVerbose )
//            fprintf( stdout, "\r" );
            fprintf( stdout, "\n" );

        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
//            Extra_bddPrint( dd, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
            fflush( stdout ); 
        }

    }
    Cudd_RecursiveDeref( dd, bNext );
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // undo the image tree
    if ( pPars->fPartition )
        Bbr_bddImageTreeDelete( pTree );
    else
        Bbr_bddImageTreeDelete2( pTree2 );
    if ( bReached == NULL )
        return 0; // proved reachable
    // report the stats
    if ( pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(dd, bReached, Saig_ManRegNum(p) );
        if ( nIters > pPars->nIterMax || nBddSize > pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p)) );
        fflush( stdout );
    }
//ABC_PRB( dd, bReached );
    Cudd_RecursiveDeref( dd, bReached );
    // SPG
    //
    if ( fixedPoint ) {
      if ( !pPars->fSilent ) {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
      }
      pPars->iFrame = nIters - 1;
      return 1;
    }
    assert(nIters >= pPars->nIterMax || nBddSize >= pPars->nBddMax);
    if ( !pPars->fSilent )
      printf( "Verified only for states reachable in %d frames.  ", nIters );
    pPars->iFrame = nIters - 1;
    return -1; // undecided
}